

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathQuat.h
# Opt level: O2

Matrix33<float> * __thiscall Imath_3_2::Quat<float>::toMatrix33(Quat<float> *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Matrix33<float> *in_RDI;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  uVar1 = (this->v).y;
  uVar3 = (this->v).z;
  fVar6 = (float)uVar1 * (float)uVar1 + (float)uVar3 * (float)uVar3;
  in_RDI->x[0][0] = 1.0 - (fVar6 + fVar6);
  uVar2 = this->r;
  uVar4 = (this->v).x;
  fVar7 = (float)uVar4 * (float)uVar3 + (float)uVar1 * (float)uVar2;
  fVar8 = (float)uVar1 * (float)uVar3 + (float)uVar2 * (float)uVar4;
  fVar9 = (float)uVar4 * (float)uVar1 - (float)uVar3 * (float)uVar2;
  fVar11 = (float)uVar1 * (float)uVar4 + (float)uVar3 * (float)uVar2;
  fVar12 = (float)uVar3 * (float)uVar4 + -((float)uVar1 * (float)uVar2);
  fVar5 = (float)uVar3 * (float)uVar3 + (float)uVar4 * (float)uVar4;
  fVar6 = (float)uVar3 * (float)uVar1 - (float)uVar2 * (float)uVar4;
  fVar10 = (float)uVar4 * (float)uVar4 + (float)uVar1 * (float)uVar1;
  *(ulong *)(in_RDI->x[0] + 1) = CONCAT44(fVar12 + fVar12,fVar11 + fVar11);
  in_RDI->x[1][0] = fVar9 + fVar9;
  in_RDI->x[1][1] = 1.0 - (fVar5 + fVar5);
  *(ulong *)(in_RDI->x[1] + 2) = CONCAT44(fVar7 + fVar7,fVar8 + fVar8);
  in_RDI->x[2][1] = fVar6 + fVar6;
  in_RDI->x[2][2] = 1.0 - (fVar10 + fVar10);
  return in_RDI;
}

Assistant:

IMATH_HOSTDEVICE constexpr inline Matrix33<T>
Quat<T>::toMatrix33 () const IMATH_NOEXCEPT
{
    return Matrix33<T> (
        1 - 2 * (v.y * v.y + v.z * v.z),
        2 * (v.x * v.y + v.z * r),
        2 * (v.z * v.x - v.y * r),

        2 * (v.x * v.y - v.z * r),
        1 - 2 * (v.z * v.z + v.x * v.x),
        2 * (v.y * v.z + v.x * r),

        2 * (v.z * v.x + v.y * r),
        2 * (v.y * v.z - v.x * r),
        1 - 2 * (v.y * v.y + v.x * v.x));
}